

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-preprocess.cpp
# Opt level: O2

bool dg::llvmdg::
     hasRelevantPredecessor<std::set<llvm::BasicBlock*,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>>
               (BasicBlock *B,
               set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
               *relevant)

{
  PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_> PVar1;
  size_type sVar2;
  pred_range pVar3;
  BasicBlock *p;
  PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_> __begin2;
  key_type local_38;
  PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_> local_30;
  
  pVar3 = llvm::predecessors(B);
  local_30 = pVar3.begin_iterator.It.UI.U;
  while (PVar1.It.UI.U = local_30.It.UI.U, local_30.It.UI.U != pVar3.end_iterator.It.UI.U.It) {
    local_38 = *(key_type *)(*(long *)((long)local_30.It.UI.U + 0x18) + 0x28);
    sVar2 = std::
            set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
            ::count(relevant,&local_38);
    if (sVar2 != 0) break;
    llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>::operator++
              (&local_30);
  }
  return PVar1.It.UI.U != pVar3.end_iterator.It.UI.U.It;
}

Assistant:

inline bool hasRelevantPredecessor(llvm::BasicBlock *B, const C &relevant) {
    for (auto *p : llvm::predecessors(B)) {
        if (relevant.count(p) > 0)
            return true;
    }
    return false;
}